

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_next_of_sample(xm_channel_context_t *ch)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  long in_RDI;
  float endval;
  uint32_t b;
  uint32_t a;
  float t;
  float v;
  float u;
  float local_70;
  uint local_6c;
  uint local_5c;
  uint local_4c;
  float local_3c;
  float local_2c;
  float local_18;
  float local_14;
  float local_4;
  
  if (((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RDI + 0x10) == 0)) ||
     (*(float *)(in_RDI + 0x20) <= 0.0 && *(float *)(in_RDI + 0x20) != 0.0)) {
    if (*(ulong *)(in_RDI + 0xa8) < 0x20) {
      local_2c = (float)*(ulong *)(in_RDI + 0xa8);
      local_4 = (local_2c / 32.0) * (0.0 - *(float *)(in_RDI + 0xb0 + *(long *)(in_RDI + 0xa8) * 4))
                + *(float *)(in_RDI + 0xb0 + *(ulong *)(in_RDI + 0xa8) * 4);
    }
    else {
      local_4 = 0.0;
    }
  }
  else if (*(int *)(*(long *)(in_RDI + 0x10) + 4) == 0) {
    local_4 = 0.0;
  }
  else {
    uVar3 = (ulong)*(float *)(in_RDI + 0x20);
    local_6c = (uint)uVar3;
    local_5c = local_6c + 1;
    fVar1 = *(float *)(in_RDI + 0x20);
    local_18 = xm_sample_at(*(xm_sample_t **)(in_RDI + 0x10),uVar3 & 0xffffffff);
    iVar2 = *(int *)(*(long *)(in_RDI + 0x10) + 0x1c);
    local_14 = local_18;
    if (iVar2 == 0) {
      if (local_5c < *(uint *)(*(long *)(in_RDI + 0x10) + 4)) {
        local_3c = xm_sample_at(*(xm_sample_t **)(in_RDI + 0x10),(ulong)local_5c);
      }
      else {
        local_3c = 0.0;
      }
      local_18 = local_3c;
      *(float *)(in_RDI + 0x20) = *(float *)(in_RDI + 0x20) + *(float *)(in_RDI + 0x2c);
      if ((float)*(uint *)(*(long *)(in_RDI + 0x10) + 4) <= *(float *)(in_RDI + 0x20)) {
        *(undefined4 *)(in_RDI + 0x20) = 0xbf800000;
      }
    }
    else if (iVar2 == 1) {
      local_4c = local_5c;
      if (local_5c == *(uint *)(*(long *)(in_RDI + 0x10) + 0x10)) {
        local_4c = *(uint *)(*(long *)(in_RDI + 0x10) + 8);
      }
      local_18 = xm_sample_at(*(xm_sample_t **)(in_RDI + 0x10),(ulong)local_4c);
      *(float *)(in_RDI + 0x20) = *(float *)(in_RDI + 0x2c) + *(float *)(in_RDI + 0x20);
      while ((float)*(uint *)(*(long *)(in_RDI + 0x10) + 0x10) <= *(float *)(in_RDI + 0x20)) {
        *(float *)(in_RDI + 0x20) =
             *(float *)(in_RDI + 0x20) - (float)*(uint *)(*(long *)(in_RDI + 0x10) + 0xc);
      }
    }
    else if (iVar2 == 2) {
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
        *(float *)(in_RDI + 0x20) = *(float *)(in_RDI + 0x20) - *(float *)(in_RDI + 0x2c);
      }
      else {
        *(float *)(in_RDI + 0x20) = *(float *)(in_RDI + 0x2c) + *(float *)(in_RDI + 0x20);
      }
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
        if ((local_5c != 1) && (*(uint *)(*(long *)(in_RDI + 0x10) + 8) < local_6c - 1)) {
          local_6c = local_6c - 1;
        }
        local_14 = xm_sample_at(*(xm_sample_t **)(in_RDI + 0x10),(ulong)local_6c);
        if (*(float *)(in_RDI + 0x20) <= (float)*(uint *)(*(long *)(in_RDI + 0x10) + 8)) {
          *(undefined1 *)(in_RDI + 0x30) = 1;
          *(float *)(in_RDI + 0x20) =
               (float)(uint)(*(int *)(*(long *)(in_RDI + 0x10) + 8) * 2) - *(float *)(in_RDI + 0x20)
          ;
        }
        if (*(float *)(in_RDI + 0x20) <= 0.0) {
          *(undefined1 *)(in_RDI + 0x30) = 1;
          *(undefined4 *)(in_RDI + 0x20) = 0;
        }
      }
      else {
        if (*(uint *)(*(long *)(in_RDI + 0x10) + 0x10) <= local_5c) {
          local_5c = local_6c;
        }
        local_18 = xm_sample_at(*(xm_sample_t **)(in_RDI + 0x10),(ulong)local_5c);
        if ((float)*(uint *)(*(long *)(in_RDI + 0x10) + 0x10) <= *(float *)(in_RDI + 0x20)) {
          *(undefined1 *)(in_RDI + 0x30) = 0;
          *(float *)(in_RDI + 0x20) =
               (float)(uint)(*(int *)(*(long *)(in_RDI + 0x10) + 0x10) * 2) -
               *(float *)(in_RDI + 0x20);
        }
        if ((float)*(uint *)(*(long *)(in_RDI + 0x10) + 4) <= *(float *)(in_RDI + 0x20)) {
          *(undefined1 *)(in_RDI + 0x30) = 0;
          *(float *)(in_RDI + 0x20) =
               *(float *)(in_RDI + 0x20) - (float)(*(int *)(*(long *)(in_RDI + 0x10) + 4) - 1);
        }
      }
    }
    else {
      local_18 = 0.0;
    }
    local_4 = (fVar1 - (float)(uVar3 & 0xffffffff)) * (local_18 - local_14) + local_14;
    if (*(ulong *)(in_RDI + 0xa8) < 0x20) {
      local_70 = (float)*(ulong *)(in_RDI + 0xa8);
      local_4 = (local_70 / 32.0) *
                (local_4 - *(float *)(in_RDI + 0xb0 + *(long *)(in_RDI + 0xa8) * 4)) +
                *(float *)(in_RDI + 0xb0 + *(ulong *)(in_RDI + 0xa8) * 4);
    }
  }
  return local_4;
}

Assistant:

static float xm_next_of_sample(xm_channel_context_t* ch) {
	if(ch->instrument == NULL || ch->sample == NULL || ch->sample_position < 0) {
#if XM_RAMPING
		if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
			return XM_LERP(ch->end_of_previous_sample[ch->frame_count], .0f,
			               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
		}
#endif
		return .0f;
	}
	if(ch->sample->length == 0) {
		return .0f;
	}

	float u, v, t;
	uint32_t a, b;
	a = (uint32_t)ch->sample_position; /* This cast is fine,
										* sample_position will not
										* go above integer
										* ranges */
	if(XM_LINEAR_INTERPOLATION) {
		b = a + 1;
		t = ch->sample_position - a; /* Cheaper than fmodf(., 1.f) */
	}
	u = xm_sample_at(ch->sample, a);

	switch(ch->sample->loop_type) {

	case XM_NO_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = (b < ch->sample->length) ? xm_sample_at(ch->sample, b) : .0f;
		}
		ch->sample_position += ch->step;
		if(ch->sample_position >= ch->sample->length) {
			ch->sample_position = -1;
		}
		break;

	case XM_FORWARD_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = xm_sample_at(
				ch->sample,
				(b == ch->sample->loop_end) ? ch->sample->loop_start : b
				);
		}
		ch->sample_position += ch->step;
		while(ch->sample_position >= ch->sample->loop_end) {
			ch->sample_position -= ch->sample->loop_length;
		}
		break;

	case XM_PING_PONG_LOOP:
		if(ch->ping) {
			ch->sample_position += ch->step;
		} else {
			ch->sample_position -= ch->step;
		}
		/* XXX: this may not work for very tight ping-pong loops
		 * (ie switches direction more than once per sample */
		if(ch->ping) {
			if(XM_LINEAR_INTERPOLATION) {
				v = xm_sample_at(ch->sample, (b >= ch->sample->loop_end) ? a : b);
			}
			if(ch->sample_position >= ch->sample->loop_end) {
				ch->ping = false;
				ch->sample_position = (ch->sample->loop_end << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position >= ch->sample->length) {
				ch->ping = false;
				ch->sample_position -= ch->sample->length - 1;
			}
		} else {
			if(XM_LINEAR_INTERPOLATION) {
				v = u;
				u = xm_sample_at(
					ch->sample,
					(b == 1 || b - 2 <= ch->sample->loop_start) ? a : (b - 2)
					);
			}
			if(ch->sample_position <= ch->sample->loop_start) {
				ch->ping = true;
				ch->sample_position = (ch->sample->loop_start << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position <= .0f) {
				ch->ping = true;
				ch->sample_position = .0f;
			}
		}
		break;

	default:
		v = .0f;
		break;
	}

	float endval = (XM_LINEAR_INTERPOLATION ? XM_LERP(u, v, t) : u);

#if XM_RAMPING
	if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
		/* Smoothly transition between old and new sample. */
		return XM_LERP(ch->end_of_previous_sample[ch->frame_count], endval,
		               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
	}
#endif

	return endval;
}